

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O3

wchar_t pm(char *p,char *s,wchar_t flags)

{
  bool bVar1;
  bool bVar2;
  wchar_t wVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  bool bVar10;
  
  if ((*s == '.') && (s[1] == '/')) {
    s = s + 1;
    bVar5 = 0x2f;
    do {
      if (bVar5 == 0x2e) {
        bVar5 = ((byte *)s)[1];
        if ((bVar5 != 0x2f) && (bVar5 != 0)) break;
      }
      else {
        if (bVar5 != 0x2f) break;
        bVar5 = ((byte *)s)[1];
      }
      s = (char *)((byte *)s + 1);
    } while( true );
  }
  if ((*p == '.') && (p[1] == '/')) {
    p = p + 1;
    bVar5 = 0x2f;
    do {
      if (bVar5 == 0x2e) {
        bVar5 = ((byte *)p)[1];
        if ((bVar5 != 0x2f) && (bVar5 != 0)) break;
      }
      else {
        if (bVar5 != 0x2f) break;
        bVar5 = ((byte *)p)[1];
      }
      p = (char *)((byte *)p + 1);
    } while( true );
  }
LAB_005a5a03:
  bVar5 = *p;
  if (bVar5 < 0x3f) {
    if (bVar5 < 0x2a) {
      if (bVar5 == 0x24) {
        if (((flags & 2U) != 0) && (((byte *)p)[1] == 0)) goto LAB_005a5c2b;
      }
      else if (bVar5 == 0) {
        bVar5 = *s;
        if (bVar5 != 0x2f) goto LAB_005a5cb9;
        bVar10 = true;
        if ((flags & 2U) != 0) goto LAB_005a5cbc;
        bVar5 = 0x2f;
        goto LAB_005a5c6a;
      }
    }
    else {
      if (bVar5 == 0x2f) {
        bVar5 = *s;
        if ((bVar5 == 0x2f) || (bVar5 == 0)) {
          p = (char *)((byte *)p + -1);
          bVar6 = 0x2f;
          do {
            if (bVar6 == 0x2e) {
              bVar7 = ((byte *)p)[2];
              if ((bVar7 != 0) && (bVar7 != 0x2f)) goto LAB_005a5af7;
            }
            else {
              if (bVar6 != 0x2f) goto LAB_005a5af7;
              bVar7 = ((byte *)p)[2];
            }
            bVar6 = bVar7;
            p = (char *)((byte *)p + 1);
          } while( true );
        }
        goto LAB_005a5cb0;
      }
      if (bVar5 == 0x2a) goto LAB_005a5c47;
    }
LAB_005a5bfb:
    if (bVar5 != *s) goto LAB_005a5cb0;
  }
  else if (bVar5 == 0x3f) {
    if (*s == 0) goto LAB_005a5cb0;
  }
  else {
    if (bVar5 == 0x5b) {
      pbVar9 = (byte *)p + 1;
      pbVar4 = pbVar9;
      do {
        bVar5 = *pbVar4;
        if (bVar5 == 0x5c) {
          if (pbVar4[1] != 0) {
            pbVar4 = pbVar4 + 1;
          }
        }
        else {
          if (bVar5 == 0) {
            if (*s != 0x5b) goto LAB_005a5cb0;
            goto LAB_005a5c11;
          }
          if (bVar5 == 0x5d) goto LAB_005a5b35;
        }
        pbVar4 = pbVar4 + 1;
      } while( true );
    }
    if (bVar5 != 0x5c) goto LAB_005a5bfb;
    if (((byte *)p)[1] == 0) {
      if (*s == 0x5c) goto LAB_005a5c11;
      goto LAB_005a5cb0;
    }
    if (((byte *)p)[1] != *s) goto LAB_005a5cb0;
    p = (char *)((byte *)p + 1);
  }
LAB_005a5c11:
  p = (char *)((byte *)p + 1);
  s = (char *)((byte *)s + 1);
  goto LAB_005a5a03;
LAB_005a5c47:
  while (bVar5 == 0x2a) {
    pbVar9 = (byte *)p + 1;
    p = (char *)((byte *)p + 1);
    bVar5 = *pbVar9;
  }
  if (bVar5 == 0) {
LAB_005a5c53:
    bVar10 = true;
  }
  else if (*s == 0) {
LAB_005a5cb0:
    bVar10 = false;
  }
  else {
    do {
      wVar3 = __archive_pathmatch(p,s,flags);
      bVar10 = wVar3 != L'\0';
      if (bVar10) break;
      pbVar9 = (byte *)s + 1;
      s = (char *)((byte *)s + 1);
    } while (*pbVar9 != 0);
  }
  goto LAB_005a5cbc;
LAB_005a5af7:
  s = (char *)((byte *)s + -1);
  do {
    if (bVar5 == 0x2e) {
      bVar5 = ((byte *)s)[2];
      if ((bVar5 != 0x2f) && (bVar5 != 0)) break;
    }
    else {
      if (bVar5 != 0x2f) break;
      bVar5 = ((byte *)s)[2];
    }
    s = (char *)((byte *)s + 1);
  } while( true );
  if (((flags & 2U) != 0) && (bVar6 == 0)) goto LAB_005a5c53;
  goto LAB_005a5c11;
LAB_005a5c2b:
  do {
    do {
      pbVar9 = (byte *)s + 1;
      bVar5 = *s;
      s = (char *)pbVar9;
    } while (bVar5 == 0x2f);
  } while ((bVar5 == 0x2e) && ((*pbVar9 == 0x2f || (*pbVar9 == 0))));
  goto LAB_005a5cb9;
LAB_005a5b35:
  bVar10 = true;
  if (((*pbVar9 == 0x5e) || (bVar2 = false, *pbVar9 == 0x21)) && (bVar2 = false, pbVar9 < pbVar4)) {
    pbVar9 = (byte *)p + 2;
    bVar2 = true;
    bVar10 = false;
  }
  bVar1 = bVar2;
  if (pbVar9 < pbVar4) {
    bVar5 = *s;
    bVar6 = 0;
    do {
      bVar7 = *pbVar9;
      bVar1 = bVar10;
      if (bVar7 == 0x5c) {
        bVar7 = pbVar9[1];
        pbVar9 = pbVar9 + 1;
LAB_005a5ba4:
        if (bVar7 == bVar5) break;
      }
      else {
        if (bVar7 != 0x2d) goto LAB_005a5ba4;
        if ((bVar6 == 0) || (pbVar9 == pbVar4 + -1)) {
          if (bVar5 == 0x2d) break;
          bVar7 = 0;
        }
        else {
          bVar8 = pbVar9[1];
          if (bVar8 == 0x5c) {
            bVar8 = pbVar9[2];
            pbVar9 = pbVar9 + 2;
          }
          else {
            pbVar9 = pbVar9 + 1;
          }
          bVar7 = 0;
          if (((char)bVar6 <= (char)bVar5) && ((char)bVar5 <= (char)bVar8)) break;
        }
      }
      pbVar9 = pbVar9 + 1;
      bVar6 = bVar7;
      bVar1 = bVar2;
    } while (pbVar9 < pbVar4);
  }
  p = (char *)pbVar4;
  if (!bVar1) goto LAB_005a5cb0;
  goto LAB_005a5c11;
  while ((bVar5 = *s, bVar5 == 0x2f || (bVar5 == 0))) {
LAB_005a5c6a:
    pbVar9 = (byte *)s;
    s = (char *)(pbVar9 + 1);
    if (bVar5 != 0x2e) {
      if (bVar5 != 0x2f) break;
      bVar5 = *s;
      goto LAB_005a5c6a;
    }
  }
  bVar5 = *pbVar9;
LAB_005a5cb9:
  bVar10 = bVar5 == 0;
LAB_005a5cbc:
  return (wchar_t)bVar10;
}

Assistant:

static int
pm(const char *p, const char *s, int flags)
{
	const char *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == '.' && s[1] == '/')
		s = pm_slashskip(s + 1);
	if (p[0] == '.' && p[1] == '/')
		p = pm_slashskip(p + 1);

	for (;;) {
		switch (*p) {
		case '\0':
			if (s[0] == '/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip(s);
			}
			return (*s == '\0');
		case '?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == '\0')
				return (0);
			break;
		case '*':
			/* "*" == "**" == "***" ... */
			while (*p == '*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == '\0')
				return (1);
			while (*s) {
				if (archive_pathmatch(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case '[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != '\0' && *end != ']') {
				if (*end == '\\' && end[1] != '\0')
					++end;
				++end;
			}
			if (*end == ']') {
				/* We found [...], try to match it. */
				if (!pm_list(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case '\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == '\0') {
				if (*s != '\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case '/':
			if (*s != '/' && *s != '\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip(p);
			s = pm_slashskip(s);
			if (*p == '\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case '$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == '\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip(s) == '\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}